

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

void __thiscall
embree::SceneGraph::HairSetNode::HairSetNode
          (HairSetNode *this,RTCGeometryType type,Ref<embree::SceneGraph::MaterialNode> *material,
          BBox1f time_range,size_t numTimeSteps)

{
  MaterialNode *pMVar1;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> vStack_48;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = true;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__HairSetNode_001da698;
  this->time_range = time_range;
  this->type = type;
  memset(&this->positions,0,0x90);
  pMVar1 = material->ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  this->tessellation_rate = 4;
  if (numTimeSteps != 0) {
    do {
      vStack_48.size_active = 0;
      vStack_48.size_alloced = 0;
      vStack_48.items = (Vec3fx *)0x0;
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&this->positions,&vStack_48);
      alignedFree(vStack_48.items);
      numTimeSteps = numTimeSteps - 1;
    } while (numTimeSteps != 0);
  }
  return;
}

Assistant:

HairSetNode (RTCGeometryType type, Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0)
        : Node(true), time_range(time_range), type(type), material(material), tessellation_rate(4)
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
      }